

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

void __thiscall
entityx::EntityManager::ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::next
          (ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> *this)

{
  bool bVar1;
  Id id;
  EntityManager *in_RDI;
  Entity entity;
  byte local_29;
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> *in_stack_ffffffffffffffe0;
  Entity local_18;
  
  while( true ) {
    local_29 = 0;
    if ((pointer)(ulong)*(uint *)&in_RDI->event_manager_ <
        (in_RDI->component_pools_).
        super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar1 = predicate(in_stack_ffffffffffffffe0);
      local_29 = bVar1 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    *(int *)&in_RDI->event_manager_ = *(int *)&in_RDI->event_manager_ + 1;
  }
  if ((pointer)(ulong)*(uint *)&in_RDI->event_manager_ <
      (in_RDI->component_pools_).
      super__Vector_base<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    id = create_id((EntityManager *)in_RDI->_vptr_EntityManager,0);
    local_18 = get(in_RDI,id);
    BaseView<true>::Iterator::next_entity((Iterator *)in_RDI,&local_18);
  }
  return;
}

Assistant:

void next() {
      while (i_ < capacity_ && !predicate()) {
        ++i_;
      }

      if (i_ < capacity_) {
        Entity entity = manager_->get(manager_->create_id(i_));
        static_cast<Delegate*>(this)->next_entity(entity);
      }
    }